

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O2

StatusOr<bool> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetBool(UnparseProto3Type *this,Field f)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  StatusOr<bool> SVar3;
  Status SStack_98;
  AlphaNum local_90;
  AlphaNum local_40;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((ulong)(f->raw_->field_0)._impl_.default_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  if (__lhs->_M_string_length == 0) {
LAB_002a247f:
    this[8] = (UnparseProto3Type)0x0;
  }
  else {
    bVar1 = std::operator==(__lhs,"false");
    in_RDX = extraout_RDX;
    if (bVar1) goto LAB_002a247f;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)(f->raw_->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc),"true");
    if (!bVar1) {
      local_40.piece_ = absl::lts_20240722::NullSafeStringView("bad default value in type.proto: ");
      pcVar2 = (char *)((ulong)(f->parent_->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc);
      local_90.digits_._24_8_ = *(undefined8 *)pcVar2;
      local_90.digits_._16_8_ = *(undefined8 *)(pcVar2 + 8);
      absl::lts_20240722::StrCat_abi_cxx11_(&local_90,&local_40);
      absl::lts_20240722::InternalError(&SStack_98,local_90.piece_._M_str,local_90.piece_._M_len);
      absl::lts_20240722::internal_statusor::StatusOrData<bool>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<bool> *)this,&SStack_98);
      absl::lts_20240722::Status::~Status(&SStack_98);
      std::__cxx11::string::~string((string *)&local_90);
      in_RDX = extraout_RDX_01;
      goto LAB_002a248a;
    }
    this[8] = (UnparseProto3Type)0x1;
    in_RDX = extraout_RDX_00;
  }
  *(undefined8 *)this = 1;
LAB_002a248a:
  SVar3.super_StatusOrData<bool>._8_8_ = in_RDX;
  SVar3.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)this;
  return (StatusOr<bool>)SVar3.super_StatusOrData<bool>;
}

Assistant:

static absl::StatusOr<bool> GetBool(Field f) {
    if (f->proto().default_value().empty()) {
      return false;
    } else if (f->proto().default_value() == "false") {
      return false;
    } else if (f->proto().default_value() == "true") {
      return true;
    } else {
      return absl::InternalError(absl::StrCat(
          "bad default value in type.proto: ", f->parent().proto().name()));
    }
  }